

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclareFixture.hpp
# Opt level: O3

int __thiscall
ut11::detail::DeclareFixtureObj<IsNotStringContainingCharacterTests>::operator()<>
          (DeclareFixtureObj<IsNotStringContainingCharacterTests> *this,Category *category)

{
  undefined8 *puVar1;
  pointer pcVar2;
  TestFixture *this_00;
  undefined8 *puVar3;
  ulong uVar4;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  _Head_base<0UL,_IsNotStringContainingCharacterTests_*,_false> local_b8;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  shared_ptr<ut11::detail::TestFixtureAbstract> local_70;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined2 *local_40;
  undefined8 local_38;
  undefined2 local_30 [8];
  
  this_00 = (TestFixture *)operator_new(0x60);
  (this_00->super_TestFixtureAbstract)._vptr_TestFixtureAbstract = (_func_int **)0x0;
  (this_00->m_name)._M_dataplus._M_p = (pointer)0x0;
  (this_00->m_name)._M_string_length = 0;
  (this_00->m_name).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this_00->m_name).field_2 + 8) = 0;
  (this_00->m_StageBuilder)._M_t.
  super___uniq_ptr_impl<ut11::detail::TestStageBuilder,_std::default_delete<ut11::detail::TestStageBuilder>_>
  ._M_t.
  super__Tuple_impl<0UL,_ut11::detail::TestStageBuilder_*,_std::default_delete<ut11::detail::TestStageBuilder>_>
  .super__Head_base<0UL,_ut11::detail::TestStageBuilder_*,_false>._M_head_impl =
       (TestStageBuilder *)0x0;
  *(undefined8 *)&(this_00->m_categories)._M_t._M_impl = 0;
  *(undefined8 *)&(this_00->m_categories)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this_00->m_categories)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this_00->m_categories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this_00->m_categories)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this_00->m_categories)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  TestFixture::TestFixture(this_00);
  (this_00->super_TestFixtureAbstract)._vptr_TestFixtureAbstract =
       (_func_int **)&PTR__TestFixture_00262e80;
  pcVar2 = (this->m_name)._M_dataplus._M_p;
  local_b8._M_head_impl = (IsNotStringContainingCharacterTests *)this_00;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + (this->m_name)._M_string_length);
  std::__cxx11::string::append((char *)&local_90);
  local_30[0] = 0x29;
  local_38 = 1;
  uVar4 = 0xf;
  if (local_90 != local_80) {
    uVar4 = local_80[0];
  }
  local_40 = local_30;
  if ((local_88 + 1U < 0x10) && (uVar4 < local_88 + 1U)) {
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,(ulong)local_90);
  }
  else {
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_30);
  }
  local_b0 = &local_a0;
  puVar1 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar1) {
    local_a0 = *puVar1;
    uStack_98 = puVar3[3];
  }
  else {
    local_a0 = *puVar1;
    local_b0 = (undefined8 *)*puVar3;
  }
  local_a8 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::__cxx11::string::_M_assign((string *)&this_00->m_name);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  pcVar2 = (category->m_category)._M_dataplus._M_p;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar2,pcVar2 + (category->m_category)._M_string_length);
  (*(this_00->super_TestFixtureAbstract)._vptr_TestFixtureAbstract[2])(this_00,local_60);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  std::__shared_ptr<ut11::detail::TestFixtureAbstract,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<IsNotStringContainingCharacterTests,std::default_delete<IsNotStringContainingCharacterTests>,void>
            ((__shared_ptr<ut11::detail::TestFixtureAbstract,(__gnu_cxx::_Lock_policy)2> *)&local_70
             ,(unique_ptr<IsNotStringContainingCharacterTests,_std::default_delete<IsNotStringContainingCharacterTests>_>
               *)&local_b8);
  PushFixture(&local_70);
  if (local_70.super___shared_ptr<ut11::detail::TestFixtureAbstract,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.
               super___shared_ptr<ut11::detail::TestFixtureAbstract,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (&(local_b8._M_head_impl)->super_TestFixture != (TestFixture *)0x0) {
    (*((local_b8._M_head_impl)->super_TestFixture).super_TestFixtureAbstract.
      _vptr_TestFixtureAbstract[1])();
  }
  return 0;
}

Assistant:

int operator()(Category category, ARGS && ... args)
			{
				std::unique_ptr<T> fixture(new T(std::forward<ARGS>(args)...));
				fixture->SetName(m_name + "(" + GetString(args...));
				fixture->AddCategory(category);

				PushFixture(std::move(fixture));
				return 0;
			}